

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobjectmanager.hpp
# Opt level: O0

void __thiscall
CorUnix::CSharedMemoryObjectManager::CSharedMemoryObjectManager(CSharedMemoryObjectManager *this)

{
  CSharedMemoryObjectManager *this_local;
  
  IPalObjectManager::IPalObjectManager(&this->super_IPalObjectManager);
  (this->super_IPalObjectManager)._vptr_IPalObjectManager =
       (_func_int **)&PTR_AllocateObject_0047b008;
  this->m_fListLockInitialized = false;
  CSimpleHandleManager::CSimpleHandleManager(&this->m_HandleManager);
  return;
}

Assistant:

CSharedMemoryObjectManager()
            :
            m_fListLockInitialized(FALSE)
        {
        }